

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O2

HashBlock *
compress(HashBlock *__return_storage_ptr__,
        vector<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>,_std::allocator<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>_>_>
        *m)

{
  long *plVar1;
  long *plVar2;
  pointer pvVar3;
  _Base_bitset<1UL> _Var4;
  _Base_bitset<1UL> _Var5;
  _Base_bitset<1UL> _Var6;
  _Base_bitset<1UL> _Var7;
  ExpansionBlock EVar8;
  ExpansionBlock EVar9;
  ExpansionBlock EVar10;
  ExpansionBlock EVar11;
  ExpansionBlock EVar12;
  _Base_bitset<1UL> _Var13;
  ulong uVar14;
  _Base_bitset<1UL> _Var15;
  _Base_bitset<1UL> _Var16;
  long lVar17;
  _Base_bitset<1UL> _Var18;
  long lVar19;
  _Base_bitset<1UL> _Var20;
  _Base_bitset<1UL> _Var21;
  _Base_bitset<1UL> _Var22;
  HashBlockSegment hs [8];
  ExpansionBlockVec mi;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  hs[6].super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)0x1f83d9ab;
  hs[7].super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)0x5be0cd19;
  hs[4].super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)0x510e527f;
  hs[5].super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)0x9b05688c;
  hs[2].super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)0x3c6ef372;
  hs[3].super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)0xa54ff53a;
  hs[0].super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)0x6a09e667;
  hs[1].super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)0xbb67ae85;
  uVar14 = 0;
  while( true ) {
    pvVar3 = (m->
             super__Vector_base<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>,_std::allocator<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(m->
                       super__Vector_base<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>,_std::allocator<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3) / 0x18) <= uVar14
       ) break;
    std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>::vector(&mi,pvVar3 + uVar14)
    ;
    lVar19 = 0;
    _Var4 = hs[6].super__Base_bitset<1UL>._M_w;
    _Var5 = hs[2].super__Base_bitset<1UL>._M_w;
    _Var15 = hs[5].super__Base_bitset<1UL>._M_w;
    _Var16 = hs[4].super__Base_bitset<1UL>._M_w;
    _Var6 = hs[0].super__Base_bitset<1UL>._M_w;
    _Var20 = hs[3].super__Base_bitset<1UL>._M_w;
    _Var21 = hs[1].super__Base_bitset<1UL>._M_w;
    _Var22 = hs[7].super__Base_bitset<1UL>._M_w;
    while( true ) {
      _Var18._M_w = _Var6._M_w;
      _Var13._M_w = _Var5._M_w;
      _Var7._M_w = _Var4._M_w;
      if (lVar19 == 0x200) break;
      EVar8 = big_sigma0((ExpansionBlock)(_Var18._M_w & 0xffffffff));
      EVar9 = maj((ExpansionBlock)(_Var18._M_w & 0xffffffff),
                  (ExpansionBlock)(_Var21._M_w & 0xffffffff),
                  (ExpansionBlock)(_Var13._M_w & 0xffffffff));
      EVar10.super__Base_bitset<1UL>._M_w._0_4_ = (int)_Var20._M_w + (int)_Var13._M_w;
      EVar10.super__Base_bitset<1UL>._M_w._4_4_ = 0;
      EVar10 = big_sigma2(EVar10);
      EVar11 = big_sigma1((ExpansionBlock)(_Var16._M_w & 0xffffffff));
      EVar12 = ch((ExpansionBlock)(_Var16._M_w & 0xffffffff),
                  (ExpansionBlock)(_Var15._M_w & 0xffffffff),
                  (ExpansionBlock)(_Var7._M_w & 0xffffffff));
      lVar17 = (long)EVar9.super__Base_bitset<1UL>._M_w + (long)EVar8.super__Base_bitset<1UL>._M_w +
               (long)EVar10.super__Base_bitset<1UL>._M_w;
      plVar1 = (long *)(&DAT_001050a0 + lVar19);
      plVar2 = (long *)((long)&((mi.
                                 super__Vector_base<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->super__Base_bitset<1UL>
                               )._M_w + lVar19);
      lVar19 = lVar19 + 8;
      _Var4._M_w = _Var16._M_w;
      _Var5._M_w = _Var18._M_w;
      _Var15._M_w = _Var16._M_w;
      _Var16._M_w = lVar17 + _Var13._M_w;
      _Var6._M_w = lVar17 * 3 -
                   (_Var22._M_w + (long)EVar11.super__Base_bitset<1UL>._M_w +
                    (long)EVar12.super__Base_bitset<1UL>._M_w + *plVar1 + *plVar2);
      _Var20._M_w = _Var13._M_w;
      _Var21._M_w = _Var18._M_w;
      _Var22._M_w = _Var7._M_w;
    }
    hs[0].super__Base_bitset<1UL>._M_w._0_4_ =
         (int)_Var18._M_w + (uint)hs[0].super__Base_bitset<1UL>._M_w;
    hs[0].super__Base_bitset<1UL>._M_w._4_4_ = 0;
    hs[1].super__Base_bitset<1UL>._M_w._0_4_ =
         (int)_Var21._M_w + (uint)hs[1].super__Base_bitset<1UL>._M_w;
    hs[1].super__Base_bitset<1UL>._M_w._4_4_ = 0;
    hs[2].super__Base_bitset<1UL>._M_w._0_4_ =
         (int)_Var13._M_w + (uint)hs[2].super__Base_bitset<1UL>._M_w;
    hs[2].super__Base_bitset<1UL>._M_w._4_4_ = 0;
    hs[3].super__Base_bitset<1UL>._M_w._0_4_ =
         (int)_Var20._M_w + (uint)hs[3].super__Base_bitset<1UL>._M_w;
    hs[3].super__Base_bitset<1UL>._M_w._4_4_ = 0;
    hs[4].super__Base_bitset<1UL>._M_w._0_4_ =
         (int)_Var16._M_w + (uint)hs[4].super__Base_bitset<1UL>._M_w;
    hs[4].super__Base_bitset<1UL>._M_w._4_4_ = 0;
    hs[5].super__Base_bitset<1UL>._M_w._0_4_ =
         (int)_Var15._M_w + (uint)hs[5].super__Base_bitset<1UL>._M_w;
    hs[5].super__Base_bitset<1UL>._M_w._4_4_ = 0;
    hs[6].super__Base_bitset<1UL>._M_w._0_4_ =
         (int)_Var7._M_w + (uint)hs[6].super__Base_bitset<1UL>._M_w;
    hs[6].super__Base_bitset<1UL>._M_w._4_4_ = 0;
    hs[7].super__Base_bitset<1UL>._M_w._0_4_ =
         (int)_Var22._M_w + (uint)hs[7].super__Base_bitset<1UL>._M_w;
    hs[7].super__Base_bitset<1UL>._M_w._4_4_ = 0;
    std::_Vector_base<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>::~_Vector_base
              (&mi.super__Vector_base<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>);
    uVar14 = uVar14 + 1;
  }
  std::bitset<32ul>::to_string<char,std::char_traits<char>,std::allocator<char>>
            (&local_110,(bitset<32ul> *)hs);
  std::bitset<32ul>::to_string<char,std::char_traits<char>,std::allocator<char>>
            (&local_130,(bitset<32ul> *)(hs + 1));
  std::operator+(&local_f0,&local_110,&local_130);
  std::bitset<32ul>::to_string<char,std::char_traits<char>,std::allocator<char>>
            (&local_150,(bitset<32ul> *)(hs + 2));
  std::operator+(&local_d0,&local_f0,&local_150);
  std::bitset<32ul>::to_string<char,std::char_traits<char>,std::allocator<char>>
            (&local_170,(bitset<32ul> *)(hs + 3));
  std::operator+(&local_b0,&local_d0,&local_170);
  std::bitset<32ul>::to_string<char,std::char_traits<char>,std::allocator<char>>
            (&local_190,(bitset<32ul> *)(hs + 4));
  std::operator+(&local_90,&local_b0,&local_190);
  std::bitset<32ul>::to_string<char,std::char_traits<char>,std::allocator<char>>
            (&local_1b0,(bitset<32ul> *)(hs + 5));
  std::operator+(&local_70,&local_90,&local_1b0);
  std::bitset<32ul>::to_string<char,std::char_traits<char>,std::allocator<char>>
            (&local_1d0,(bitset<32ul> *)(hs + 6));
  std::operator+(&local_50,&local_70,&local_1d0);
  std::bitset<32ul>::to_string<char,std::char_traits<char>,std::allocator<char>>
            (&local_1f0,(bitset<32ul> *)(hs + 7));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mi,&local_50,
                 &local_1f0);
  std::bitset<256ul>::bitset<char,std::char_traits<char>,std::allocator<char>>
            ((bitset<256ul> *)__return_storage_ptr__,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mi,0);
  std::__cxx11::string::~string((string *)&mi);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_110);
  return __return_storage_ptr__;
}

Assistant:

HashBlock compress(std::vector<ExpansionBlockVec> m)
{

    Prime a, b, c, d, e, f, g, h;

    Prime ks[] = {
            0x428a2f98,         // K0
            0x71374491,         // K1
            0xb5c0fbcf,         // K2
            0xe9b5dba5,         // K3
            0x3956c25b,         // K4
            0x59f111f1,         // K5
            0x923f82a4,         // K6
            0xab1c5ed5,         // K7
            0xd807aa98,         // K8
            0x12835b01,         // K9
            0x243185be,         // K10
            0x550c7dc3,         // K11
            0x72be5d74,         // K12
            0x80deb1fe,         // K13
            0x9bdc06a7,         // K14
            0xc19bf174,         // K15
            0xe49b69c1,         // K16
            0xefbe4786,         // K17
            0x0fc19dc6,         // K18
            0x240ca1cc,         // K19
            0x2de92c6f,         // K20
            0x4a7484aa,         // K21
            0x5cb0a9dc,         // K22
            0x76f988da,         // K23
            0x983e5152,         // K24
            0xa831c66d,         // K25
            0xb00327c8,         // K26
            0xbf597fc7,         // K27
            0xc6e00bf3,         // K28
            0xd5a79147,         // K29
            0x06ca6351,         // K30
            0x14292967,         // K31
            0x27b70a85,         // K32
            0x2e1b2138,         // K33
            0x4d2c6dfc,         // K34
            0x53380d13,         // K35
            0x650a7354,         // K36
            0x766a0abb,         // K37
            0x81c2c92e,         // K38
            0x92722c85,         // K39
            0xa2bfe8a1,         // K40
            0xa81a664b,         // K41
            0xc24b8b70,         // K42
            0xc76c51a3,         // K43
            0xd192e819,         // K44
            0xd6990624,         // K45
            0xf40e3585,         // K46
            0x106aa070,         // K47
            0x19a4c116,         // K48
            0x1e376c08,         // K49
            0x2748774c,         // K50
            0x34b0bcb5,         // K51
            0x391c0cb3,         // K52
            0x4ed8aa4a,         // K53
            0x5b9cca4f,         // K54
            0x682e6ff3,         // K55
            0x748f82ee,         // K56
            0x78a5636f,         // K57
            0x84c87814,         // K58
            0x8cc70208,         // K59
            0x90befffa,         // K60
            0xa4506ceb,         // K61
            0xbe49a3f7,         // K62
            0xc67178f2,         // K63
    };
    HashBlockSegment hs[] = {
            0x6a09e667,         // H(0, 0)
            0xbb67ae85,         // H(0, 1)
            0x3c6ef372,         // H(0, 2)
            0xa54ff53a,         // H(0, 3)
            0x510e527f,         // H(0, 4)
            0x9b05688c,         // H(0, 5)
            0x1f83d9ab,         // H(0, 6)
            0x5be0cd19          // H(0, 7)
    };


    // Iterate over all expansion blocks
    for (int i = 0; i < m.size(); ++i)
    {
        ExpansionBlockVec mi = m[i];
        a = hs[0].to_ulong();
        b = hs[1].to_ulong();
        c = hs[2].to_ulong();
        d = hs[3].to_ulong();
        e = hs[4].to_ulong();
        f = hs[5].to_ulong();
        g = hs[6].to_ulong();
        h = hs[7].to_ulong();

        for (int j = 0; j < EXPANSION_BLOCK_COUNT_IN_SET; ++j)
        {
            Prime t1 = big_sigma0(a).to_ulong() + maj(a, b, c).to_ulong() + big_sigma2(c + d).to_ulong();
            Prime t2 = h + big_sigma1(e).to_ulong() + ch(e, f, g).to_ulong() + ks[j] + mi[j].to_ulong();

            h = g;
            f = e;
            d = c;
            b = a;
            g = f;
            e = d + t1;
            c = b;
            a = 3 * t1 - t2;
        }

        hs[0] = a + hs[0].to_ulong();
        hs[1] = b + hs[1].to_ulong();
        hs[2] = c + hs[2].to_ulong();
        hs[3] = d + hs[3].to_ulong();
        hs[4] = e + hs[4].to_ulong();
        hs[5] = f + hs[5].to_ulong();
        hs[6] = g + hs[6].to_ulong();
        hs[7] = h + hs[7].to_ulong();
    }
    HashBlock result(
            hs[0].to_string() +
            hs[1].to_string() +
            hs[2].to_string() +
            hs[3].to_string() +
            hs[4].to_string() +
            hs[5].to_string() +
            hs[6].to_string() +
            hs[7].to_string()
    );

    return result;
}